

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

ProtoStreamObjectWriter * __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::EndObject(ProtoStreamObjectWriter *this)

{
  int iVar1;
  Item *pIVar2;
  bool bVar3;
  
  iVar1 = (this->super_ProtoWriter).invalid_depth_;
  if (iVar1 < 1) {
    pIVar2 = (this->current_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
             ._M_head_impl;
    if (pIVar2 != (Item *)0x0) {
      if ((pIVar2->item_type_ == ANY) &&
         (bVar3 = AnyWriter::EndObject
                            ((AnyWriter *)
                             (pIVar2->any_)._M_t.
                             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter>_>
                            ), bVar3)) {
        return this;
      }
      Pop(this);
    }
  }
  else {
    (this->super_ProtoWriter).invalid_depth_ = iVar1 + -1;
  }
  return this;
}

Assistant:

ProtoStreamObjectWriter* ProtoStreamObjectWriter::EndObject() {
  if (invalid_depth() > 0) {
    DecrementInvalidDepth();
    return this;
  }

  if (current_ == nullptr) return this;

  if (current_->IsAny()) {
    if (current_->any()->EndObject()) return this;
  }

  Pop();

  return this;
}